

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpApiRequest.cpp
# Opt level: O0

void __thiscall xmrig::HttpApiRequest::done(HttpApiRequest *this,int status)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Value *obj;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator_00;
  int in_ESI;
  ApiRequest *in_RDI;
  Value result;
  HttpApiResponse *in_stack_00000100;
  Value error;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator;
  char *in_stack_fffffffffffffe88;
  undefined1 copyConstStrings;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *in_stack_fffffffffffffe90;
  Ch *in_stack_fffffffffffffe98;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *in_stack_fffffffffffffea0;
  GenericStringRef<char> *this_00;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *in_stack_fffffffffffffed8;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *in_stack_fffffffffffffee0;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *in_stack_fffffffffffffee8;
  StringRefType *in_stack_fffffffffffffef0;
  GenericStringRef<char> *in_stack_fffffffffffffef8;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_f8 [2];
  GenericStringRef<char> local_d8;
  GenericStringRef<char> local_c8 [2];
  undefined1 local_a8 [32];
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_88 [3];
  GenericStringRef<char> local_58 [2];
  GenericStringRef<char> local_38;
  StringRefType local_28;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *local_18;
  int local_c;
  undefined4 extraout_var_01;
  
  local_c = in_ESI;
  ApiRequest::done(in_RDI,in_ESI);
  iVar2 = (*(in_RDI->super_IApiRequest)._vptr_IApiRequest[0xe])();
  if (iVar2 == 2) {
    iVar2 = (*(in_RDI->super_IApiRequest)._vptr_IApiRequest[0xc])();
    local_18 = rapidjson::
               GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
               ::GetAllocator((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                               *)CONCAT44(extraout_var,iVar2));
    HttpResponse::setStatus((HttpResponse *)&in_RDI[1].m_version,200);
    if (local_c == 200) {
      (*(in_RDI->super_IApiRequest)._vptr_IApiRequest[0xd])();
      bVar1 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::HasMember(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
      if (!bVar1) {
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::GenericValue(in_stack_fffffffffffffe90,(Type)((ulong)in_stack_fffffffffffffe88 >> 0x20));
        rapidjson::GenericStringRef<char>::GenericStringRef<7u>
                  ((GenericStringRef<char> *)(local_a8 + 0x10),(char (*) [7])0x27c274);
        in_stack_fffffffffffffed8 = (MemoryPoolAllocator<rapidjson::CrtAllocator> *)local_a8;
        rapidjson::GenericStringRef<char>::GenericStringRef<3u>
                  ((GenericStringRef<char> *)in_stack_fffffffffffffed8,(char (*) [3])0x27c0ea);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)in_RDI,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                    in_stack_fffffffffffffee8);
        (*(in_RDI->super_IApiRequest)._vptr_IApiRequest[0xd])();
        rapidjson::StringRef<char>(in_stack_fffffffffffffe88);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)in_stack_fffffffffffffef0,(StringRefType *)in_stack_fffffffffffffee8,
                    in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::~GenericValue(local_88);
      }
    }
    else {
      if (local_c == 0x194) {
        local_c = -0x7f59;
      }
      in_stack_fffffffffffffef0 = &local_28;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::GenericValue(in_stack_fffffffffffffe90,(Type)((ulong)in_stack_fffffffffffffe88 >> 0x20));
      iVar2 = (int)((ulong)in_stack_fffffffffffffee0 >> 0x20);
      in_stack_fffffffffffffef8 = &local_38;
      rapidjson::GenericStringRef<char>::GenericStringRef<5u>
                (in_stack_fffffffffffffef8,(char (*) [5])0x27c426);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<int>((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        *)in_stack_fffffffffffffef0,(StringRefType *)in_stack_fffffffffffffee8,iVar2
                       ,in_stack_fffffffffffffed8);
      rapidjson::GenericStringRef<char>::GenericStringRef<8u>(local_58,(char (*) [8])0x27c3ce);
      in_stack_fffffffffffffee8 = (MemoryPoolAllocator<rapidjson::CrtAllocator> *)rpcError(local_c);
      rapidjson::StringRef<char>(in_stack_fffffffffffffe88);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)in_RDI,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                  in_stack_fffffffffffffee8);
      iVar2 = (*(in_RDI->super_IApiRequest)._vptr_IApiRequest[0xd])();
      in_stack_fffffffffffffee0 =
           (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            *)CONCAT44(extraout_var_00,iVar2);
      rapidjson::StringRef<char>(in_stack_fffffffffffffe88);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)in_stack_fffffffffffffef0,(StringRefType *)in_stack_fffffffffffffee8,
                  in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)&local_28);
    }
    iVar2 = (*(in_RDI->super_IApiRequest)._vptr_IApiRequest[0xd])();
    obj = (Value *)CONCAT44(extraout_var_01,iVar2);
    this_00 = local_c8;
    rapidjson::GenericStringRef<char>::GenericStringRef<8u>(this_00,(char (*) [8])"jsonrpc");
    rapidjson::GenericStringRef<char>::GenericStringRef<4u>(&local_d8,(char (*) [4])"2.0");
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)in_RDI,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
              in_stack_fffffffffffffee8);
    (*(in_RDI->super_IApiRequest)._vptr_IApiRequest[0xd])();
    rapidjson::StringRef<char>(in_stack_fffffffffffffe88);
    copyConstStrings = (undefined1)((ulong)in_stack_fffffffffffffe88 >> 0x38);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    GenericValue(in_stack_fffffffffffffe90);
    (*(in_RDI->super_IApiRequest)._vptr_IApiRequest[7])();
    allocator_00 = (MemoryPoolAllocator<rapidjson::CrtAllocator> *)
                   Json::getValue(obj,(char *)in_stack_fffffffffffffe90);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>::
    CopyFrom<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)this_00,obj,allocator_00,(bool)copyConstStrings);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)in_stack_fffffffffffffef0,(StringRefType *)in_stack_fffffffffffffee8,
              in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    ~GenericValue(local_f8);
  }
  else {
    HttpResponse::setStatus((HttpResponse *)&in_RDI[1].m_version,local_c);
  }
  HttpApiResponse::end(in_stack_00000100);
  return;
}

Assistant:

void xmrig::HttpApiRequest::done(int status)
{
    ApiRequest::done(status);

    if (type() == REQ_JSON_RPC) {
        using namespace rapidjson;
        auto &allocator = doc().GetAllocator();

        m_res.setStatus(HTTP_STATUS_OK);

        if (status != HTTP_STATUS_OK) {
            if (status == HTTP_STATUS_NOT_FOUND) {
                status = RPC_METHOD_NOT_FOUND;
            }

            Value error(kObjectType);
            error.AddMember("code",    status, allocator);
            error.AddMember("message", StringRef(rpcError(status)), allocator);

            reply().AddMember(StringRef(kError), error, allocator);
        }
        else if (!reply().HasMember(kResult)) {
            Value result(kObjectType);
            result.AddMember("status", "OK", allocator);

            reply().AddMember(StringRef(kResult), result, allocator);
        }

        reply().AddMember("jsonrpc", "2.0", allocator);
        reply().AddMember(StringRef(kId), Value().CopyFrom(Json::getValue(json(), kId), allocator), allocator);
    }
    else {
        m_res.setStatus(status);
    }

    m_res.end();
}